

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitpackingaligned.cpp
# Opt level: O2

uint32_t * FastPForLib::__fastunpack19_8(uint32_t *in,uint32_t *out)

{
  ulong uVar1;
  uint uVar2;
  ulong uVar3;
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  
  uVar1 = *(ulong *)(in + 1);
  auVar7 = vpmovsxbd_avx(ZEXT416(0x1000004));
  uVar2 = *in;
  auVar10._8_8_ = 0;
  auVar10._0_8_ = uVar1;
  auVar6 = vpsllvd_avx2(auVar10,_DAT_001a0660);
  auVar8._8_4_ = 0x7e000;
  auVar8._0_8_ = 0x7ff800007e000;
  auVar8._12_4_ = 0x7ff80;
  auVar6 = vpandq_avx512vl(auVar6,auVar8);
  *out = uVar2 & 0x7ffff;
  uVar3 = *(ulong *)(in + 3);
  auVar7 = vpermi2d_avx512vl(auVar7,auVar10,ZEXT416(uVar2));
  auVar8 = vpsrlvd_avx2(auVar7,_DAT_001a08f0);
  auVar7 = vpmovsxbd_avx(ZEXT416(0x401));
  auVar6 = vpmovzxdq_avx(auVar6);
  auVar6 = vpor_avx(auVar8,auVar6);
  auVar4._8_4_ = 0x7ffff;
  auVar4._0_8_ = 0x7ffff0007ffff;
  auVar4._12_4_ = 0x7ffff;
  auVar8 = vpandd_avx512vl(auVar8,auVar4);
  auVar6 = vpblendd_avx2(auVar6,auVar8,10);
  *(undefined1 (*) [16])(out + 1) = auVar6;
  auVar9._8_8_ = 0;
  auVar9._0_8_ = uVar3;
  auVar6._8_8_ = 0;
  auVar6._0_8_ = uVar1;
  auVar7 = vpermi2d_avx512vl(auVar7,auVar6,auVar9);
  auVar6 = vpsrlvd_avx2(auVar7,_DAT_001a0900);
  auVar7 = vpsllvd_avx2(auVar9,_DAT_00195330);
  auVar5._8_4_ = 0x7fffe;
  auVar5._0_8_ = 0x7c0000007fffe;
  auVar5._12_4_ = 0x7c000;
  auVar7 = vpternlogq_avx512vl(auVar7,auVar6,auVar5,0xec);
  *(long *)(out + 5) = auVar7._0_8_;
  out[7] = (uint)(uVar3 >> 0x25) & 0x7ffff;
  return in + 5;
}

Assistant:

const uint32_t *__fastunpack19_8(const uint32_t *__restrict__ in,
                                 uint32_t *__restrict__ out) {

  *out = ((*in) >> 0) % (1U << 19);
  out++;
  *out = ((*in) >> 19);
  ++in;
  *out |= ((*in) % (1U << 6)) << (19 - 6);
  out++;
  *out = ((*in) >> 6) % (1U << 19);
  out++;
  *out = ((*in) >> 25);
  ++in;
  *out |= ((*in) % (1U << 12)) << (19 - 12);
  out++;
  *out = ((*in) >> 12) % (1U << 19);
  out++;
  *out = ((*in) >> 31);
  ++in;
  *out |= ((*in) % (1U << 18)) << (19 - 18);
  out++;
  *out = ((*in) >> 18);
  ++in;
  *out |= ((*in) % (1U << 5)) << (19 - 5);
  out++;
  *out = ((*in) >> 5) % (1U << 19);
  out++;

  return in + 1;
}